

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

bool __thiscall
Memory::HeapInfo::IsPageHeapEnabledForBlock<SmallAllocationBlockAttributes>
          (HeapInfo *this,size_t objectSize)

{
  bool bVar1;
  BOOLEAN BVar2;
  uint i;
  size_t objectSize_local;
  HeapInfo *this_local;
  
  bVar1 = IsPageHeapEnabled(this);
  if (bVar1) {
    i = GetBucketIndex(objectSize);
    BVar2 = BVStatic<48UL>::Test(&this->smallBlockPageHeapBucketFilter,i);
    this_local._7_1_ = BVar2 != '\0';
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HeapInfo::IsPageHeapEnabledForBlock(const size_t objectSize)
{
    if (IsPageHeapEnabled())
    {
        if (TBlockAttributes::IsSmallBlock)
        {
            return smallBlockPageHeapBucketFilter.Test(GetBucketIndex(objectSize)) != 0;
        }
        else if (TBlockAttributes::IsMediumBlock)
        {
            return mediumBlockPageHeapBucketFilter.Test(GetMediumBucketIndex(objectSize)) != 0;
        }
        else
        {
            return ((byte)this->pageHeapBlockType & (byte)PageHeapBlockTypeFilter::PageHeapBlockTypeFilterLarge) != 0;
        }
    }
    return false;
}